

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

string * __thiscall
settings::search_sqconfig_abi_cxx11_
          (string *__return_storage_ptr__,settings *this,char *initial_file_name)

{
  __type _Var1;
  char *pcVar2;
  char *pcVar3;
  FILE *__stream;
  int iVar4;
  bool bVar5;
  string fileName;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string bckDir;
  
  if (this == (settings *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&dir);
  }
  else {
    if (search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_ == '\0') {
      iVar4 = __cxa_guard_acquire(&search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_);
      if (iVar4 != 0) {
        std::__cxx11::string::string
                  ((string *)&search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_,"?",
                   (allocator *)&dir);
        __cxa_atexit(std::__cxx11::string::~string,
                     &search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_);
      }
    }
    if (search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_ == '\0') {
      iVar4 = __cxa_guard_acquire(&search_sqconfig[abi:cxx11](char_const*)::
                                   cachedFileName_abi_cxx11_);
      if (iVar4 != 0) {
        std::__cxx11::string::string
                  ((string *)&search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_,"?"
                   ,(allocator *)&dir);
        __cxa_atexit(std::__cxx11::string::~string,
                     &search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_);
      }
    }
    pcVar2 = strrchr((char *)this,0x5c);
    pcVar3 = strrchr((char *)this,0x2f);
    if (pcVar3 < pcVar2) {
      pcVar3 = pcVar2;
    }
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::string((string *)&dir,"",(allocator *)&fileName);
    }
    else {
      dir._M_dataplus._M_p = (pointer)&dir.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&dir,this,pcVar3 + 1);
    }
    _Var1 = std::operator==(&dir,&search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_);
    if (_Var1) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)&search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_);
    }
    else {
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName._M_string_length = 0;
      fileName.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string((string *)&bckDir,(string *)&dir);
      iVar4 = 0x10;
      while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
        std::operator+(&local_70,&bckDir,".sqconfig");
        __stream = fopen(local_70._M_dataplus._M_p,"rt");
        std::__cxx11::string::~string((string *)&local_70);
        if (__stream != (FILE *)0x0) {
          fclose(__stream);
          std::operator+(&local_70,&bckDir,".sqconfig");
          std::__cxx11::string::operator=((string *)&fileName,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          break;
        }
        std::operator+(&local_70,&bckDir,"../");
        std::__cxx11::string::operator=((string *)&bckDir,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      if (fileName._M_string_length == 0) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_70);
      }
      else {
        std::__cxx11::string::_M_assign
                  ((string *)&search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_);
        std::__cxx11::string::_M_assign
                  ((string *)&search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fileName._M_dataplus._M_p == &fileName.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(fileName.field_2._M_allocated_capacity._1_7_,
                        fileName.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = fileName.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = fileName._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(fileName.field_2._M_allocated_capacity._1_7_,
                        fileName.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = fileName._M_string_length;
        fileName._M_string_length = 0;
        fileName.field_2._M_local_buf[0] = '\0';
        fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      }
      std::__cxx11::string::~string((string *)&bckDir);
      std::__cxx11::string::~string((string *)&fileName);
    }
    std::__cxx11::string::~string((string *)&dir);
  }
  return __return_storage_ptr__;
}

Assistant:

string search_sqconfig(const char * initial_file_name)
  {
    if (!initial_file_name)
      return string("");

    static string cachedDir = "?";
    static string cachedFileName = "?";
    const char * slash1 = strrchr(initial_file_name, '\\');
    const char * slash2 = strrchr(initial_file_name, '/');
    const char * slash = slash1 > slash2 ? slash1 : slash2;
    string dir = slash ? string(initial_file_name, slash - initial_file_name + 1) : string("");
    if (dir == cachedDir)
      return cachedFileName;

    string fileName;
    string bckDir = dir;
    for (int i = 0; i < 16; i++)
    {
      if (FILE * f = fopen((bckDir + ".sqconfig").c_str(), "rt"))
      {
        fclose(f);
        fileName = bckDir + ".sqconfig";
        break;
      }
      bckDir = bckDir + "../";
    }

    if (fileName.empty())
      return string("");

    cachedDir = dir;
    cachedFileName = fileName;
    return fileName;
  }